

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringbuffer.h
# Opt level: O0

Ch * __thiscall
rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetString
          (GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this)

{
  char *pcVar1;
  Stack<rapidjson::CrtAllocator> *in_RDI;
  char *ret;
  
  if ((long)in_RDI->stackEnd_ - (long)in_RDI->stackTop_ < 1) {
    internal::Stack<rapidjson::CrtAllocator>::Expand<char>(in_RDI,(size_t)in_RDI);
  }
  pcVar1 = in_RDI->stackTop_;
  in_RDI->stackTop_ = in_RDI->stackTop_ + 1;
  *pcVar1 = '\0';
  internal::Stack<rapidjson::CrtAllocator>::Pop<char>(in_RDI,1);
  pcVar1 = internal::Stack<rapidjson::CrtAllocator>::Bottom<char>(in_RDI);
  return pcVar1;
}

Assistant:

const Ch* GetString() const {
        // Push and pop a null terminator. This is safe.
        *stack_.template Push<Ch>() = '\0';
        stack_.template Pop<Ch>(1);

        return stack_.template Bottom<Ch>();
    }